

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Music_Emu::skip_(Music_Emu *this,long count)

{
  short *psVar1;
  long in_RSI;
  long *in_RDI;
  blargg_err_t blargg_return_err__1;
  long n;
  blargg_err_t blargg_return_err_;
  int saved_mute;
  long threshold;
  undefined8 in_stack_ffffffffffffffa8;
  int mask;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar2;
  long local_38;
  long local_18;
  blargg_err_t local_8;
  
  local_18 = in_RSI;
  if (in_RSI < 0x7531) {
LAB_007fc691:
    do {
      bVar2 = 0;
      if (local_18 != 0) {
        bVar2 = *(byte *)((long)in_RDI + 0x15c) ^ 0xff;
      }
      if ((bVar2 & 1) == 0) {
        return (blargg_err_t)0x0;
      }
      local_38 = 0x800;
      if (local_18 < 0x800) {
        local_38 = local_18;
      }
      local_18 = local_18 - local_38;
      psVar1 = blargg_vector<short>::begin((blargg_vector<short> *)(in_RDI + 0x31));
      local_8 = (blargg_err_t)(**(code **)(*in_RDI + 0x80))(in_RDI,local_38,psVar1);
    } while (local_8 == (blargg_err_t)0x0);
  }
  else {
    mask = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    mute_voices((Music_Emu *)
                CONCAT17(in_stack_ffffffffffffffb7,
                         CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),mask);
    while( true ) {
      bVar2 = 0;
      if (15000 < local_18) {
        bVar2 = *(byte *)((long)in_RDI + 0x15c) ^ 0xff;
      }
      if ((bVar2 & 1) == 0) {
        mute_voices((Music_Emu *)
                    CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                    mask);
        goto LAB_007fc691;
      }
      psVar1 = blargg_vector<short>::begin((blargg_vector<short> *)(in_RDI + 0x31));
      local_8 = (blargg_err_t)(**(code **)(*in_RDI + 0x80))(in_RDI,0x800,psVar1);
      if (local_8 != (blargg_err_t)0x0) break;
      local_18 = local_18 + -0x800;
    }
  }
  return local_8;
}

Assistant:

blargg_err_t Music_Emu::skip_( long count )
{
	// for long skip, mute sound
	const long threshold = 30000;
	if ( count > threshold )
	{
		int saved_mute = mute_mask_;
		mute_voices( ~0 );
		
		while ( count > threshold / 2 && !emu_track_ended_ )
		{
			RETURN_ERR( play_( buf_size, buf.begin() ) );
			count -= buf_size;
		}
		
		mute_voices( saved_mute );
	}
	
	while ( count && !emu_track_ended_ )
	{
		long n = buf_size;
		if ( n > count )
			n = count;
		count -= n;
		RETURN_ERR( play_( n, buf.begin() ) );
	}
	return 0;
}